

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_Brep::Write(ON_Brep *this,ON_BinaryArchive *file)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  __shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  long lVar9;
  shared_ptr<const_ON_Mesh> mesh;
  
  iVar5 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,3,iVar5 < 0x33 ^ 3);
  if ((((((bVar2) && (bVar2 = ON_CurveArray::Write(&this->m_C2,file), bVar2)) &&
        (bVar2 = ON_CurveArray::Write(&this->m_C3,file), bVar2)) &&
       ((bVar2 = ON_SurfaceArray::Write(&this->m_S,file), bVar2 &&
        (bVar2 = ON_BrepVertexArray::Write(&this->m_V,file), bVar2)))) &&
      ((bVar2 = ON_BrepEdgeArray::Write(&this->m_E,file), bVar2 &&
       ((bVar2 = ON_BrepTrimArray::Write(&this->m_T,file), bVar2 &&
        (bVar2 = ON_BrepLoopArray::Write(&this->m_L,file), bVar2)))))) &&
     ((bVar2 = ON_BrepFaceArray::Write(&this->m_F,file), bVar2 &&
      ((bVar2 = ON_BinaryArchive::WritePoint(file,&(this->m_bbox).m_min), bVar2 &&
       (bVar2 = ON_BinaryArchive::WritePoint(file,&(this->m_bbox).m_max), bVar2)))))) {
    lVar6 = (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count;
    bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    if (!bVar2) {
      return false;
    }
    bVar2 = true;
    lVar9 = 0;
    for (lVar8 = 0; (bVar2 != false && (lVar8 < lVar6)); lVar8 = lVar8 + 1) {
      bVar2 = ON_BinaryArchive::Save3dmRenderMesh(file,brep_object);
      if (bVar2) {
        p_Var7 = &ON_BrepFace::SharedMesh
                            ((ON_BrepFace *)
                             ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                             lVar9 + -0x5c),render_mesh)->
                  super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,p_Var7);
        bVar2 = mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0;
      }
      else {
        mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar2 = false;
      }
      bVar2 = ON_BinaryArchive::WriteChar(file,bVar2);
      if (bVar2) {
        if (mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar2 = true;
        }
        else {
          bVar2 = ON_BinaryArchive::WriteObject
                            (file,(ON_Object *)
                                  mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
        }
      }
      else {
        bVar2 = false;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar9 = lVar9 + 0xd8;
    }
    bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar4 = false;
    if (bVar3) {
      bVar4 = bVar2;
    }
    if (bVar4 != false) {
      bVar4 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    }
    bVar2 = bVar4;
    if (bVar4 != false) {
      lVar9 = 0;
      for (lVar8 = 0; (bVar4 != false && (lVar8 < lVar6)); lVar8 = lVar8 + 1) {
        bVar2 = ON_BinaryArchive::Save3dmAnalysisMesh(file,brep_object);
        if (bVar2) {
          p_Var7 = &ON_BrepFace::SharedMesh
                              ((ON_BrepFace *)
                               ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                  super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                               lVar9 + -0x5c),analysis_mesh)->
                    super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,p_Var7);
          bVar2 = mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0;
        }
        else {
          mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          bVar2 = false;
        }
        bVar2 = ON_BinaryArchive::WriteChar(file,bVar2);
        if (bVar2) {
          if (mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar4 = true;
          }
          else {
            bVar4 = ON_BinaryArchive::WriteObject
                              (file,(ON_Object *)
                                    mesh.
                                    super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
          }
        }
        else {
          bVar4 = false;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        lVar9 = lVar9 + 0xd8;
      }
      bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
      bVar2 = false;
      if (bVar3) {
        bVar2 = bVar4;
      }
    }
    bVar4 = bVar2;
    if (bVar2 != false) {
      bVar3 = ON_BinaryArchive::WriteInt(file,this->m_is_solid);
      bVar4 = false;
      if (bVar3) {
        bVar4 = bVar2;
      }
    }
    if (bVar4 == false) {
      return false;
    }
    if ((this->m_region_topology == (ON_BrepRegionTopology *)0x0) ||
       (iVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_count, iVar1 == 0)) {
      bVar2 = false;
    }
    else {
      bVar2 = (this->m_region_topology->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
              super_ON_ClassArray<ON_BrepFaceSide>.m_count == iVar1 * 2;
    }
    if (iVar5 < 0x33) {
      if (bVar2 == false) {
        return bVar4;
      }
      iVar5 = ON_BinaryArchive::Archive3dmVersion(file);
      if (iVar5 != 0x32) {
        return bVar4;
      }
      Internal_AttachV5RegionTopologyAsUserData(this,file);
      return bVar4;
    }
    bVar4 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(file,1);
    if (bVar4) {
      bVar4 = ON_BinaryArchive::WriteBool(file,bVar2);
      bVar3 = false;
      if (bVar4) {
        if ((bVar2 == false) ||
           (bVar2 = ON_BrepRegionTopology::Write(this->m_region_topology,file), bVar2)) {
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
      bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar2) {
        return false;
      }
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool ON_Brep::Write( ON_BinaryArchive& file ) const
{
  const ON_Brep* brep = this;
  ON_Brep* v2brep = 0;


  //bool rc = file.Write3dmChunkVersion(3,0); // serialization version
  //bool rc = file.Write3dmChunkVersion(3,1); // added meshes

  int minor_version 
    = (file.Archive3dmVersion() <= 50)
    ? 2
    : 3 // August 9, 2016 m_region_topology added to V6 files.
    ;

  bool rc = file.Write3dmChunkVersion(3,minor_version); // added m_is_solid

  // 2d curves
  if (rc) rc = brep->m_C2.Write(file);

  // 3d curves
  if (rc) rc = brep->m_C3.Write(file);

  // untrimmed surfaces
  if (rc) rc = brep->m_S.Write(file);

  // vertices
  if (rc) rc = brep->m_V.Write(file);

  // edges
  if (rc) rc = brep->m_E.Write(file);

  // trims
  if (rc) rc = brep->m_T.Write(file);

  // loops
  if (rc) rc = brep->m_L.Write(file);

  // faces
  if (rc) rc = brep->m_F.Write(file);

  // bounding box
  if (rc) rc = file.WritePoint( brep->m_bbox.m_min );
  if (rc) rc = file.WritePoint( brep->m_bbox.m_max );

  // end of chunk version 3.0

  if (rc)
  {
    // added for chunk version 3.1
    const int face_count = brep->m_F.Count();
    int fi;
    unsigned char b;

    // write render meshes
    rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if ( rc )
    {
      for ( fi = 0; rc && fi < face_count; fi++ ) {
        const auto mesh = file.Save3dmRenderMesh(ON::object_type::brep_object) ? brep->m_F[fi].SharedMesh(ON::render_mesh) : nullptr;
        b = mesh ? 1 : 0;
        rc = file.WriteChar(b);
        if (rc && mesh) {
          rc = file.WriteObject(*mesh);
        }
      }
      if ( !file.EndWrite3dmChunk() )
      {
        rc = false;
      }
    }

    // write analysis meshes
    if (rc) rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if ( rc )
    {
      for ( fi = 0; rc && fi < face_count; fi++ ) {
        const auto mesh = file.Save3dmAnalysisMesh(ON::object_type::brep_object) ? brep->m_F[fi].SharedMesh(ON::analysis_mesh) : nullptr;
        b = mesh ? 1 : 0;
        rc = file.WriteChar(b);
        if (rc && mesh) {
          rc = file.WriteObject(*mesh);
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }

  }
  // end of chunk version 3.1

  if (rc)
  {
    // use value of "this" m_is_solid to avoid expensive 
    // calculation on the v2brep
    if ( !file.WriteInt( m_is_solid ) )
      rc = false;
  }

  // end of chunk version 3.2

  if (rc)
  {
    const bool bWriteRegionTopology
      = (nullptr != m_region_topology)
      && (m_F.UnsignedCount() > 0)
      && (m_region_topology->m_FS.UnsignedCount() == 2 * m_F.UnsignedCount());

    if (minor_version <= 2)
    {
      if (bWriteRegionTopology && minor_version == 2 && 50 == file.Archive3dmVersion())
        Internal_AttachV5RegionTopologyAsUserData(file);
    }
    else if (minor_version >= 3)
    {
      // begin chunk verson 3.3

      // region topology chunk added
      if (!file.BeginWrite3dmAnonymousChunk(1))
        return false;

      rc = false;
      for (;;)
      {
        if (!file.WriteBool(bWriteRegionTopology))
          break;
        if (bWriteRegionTopology)
        {
          if (!m_region_topology->Write(file))
            break;
        }
        rc = true;
        break;
      }
      if (!file.EndWrite3dmChunk())
        rc = false;
      // end chunk version 3.3
    }
  }

  if ( 0 != v2brep )
    delete v2brep;

  return rc;
}